

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

bool chaiscript::Boxed_Number::is_floating_point(Boxed_Value *t_bv)

{
  bool bVar1;
  Type_Info *pTVar2;
  Type_Info local_68;
  Type_Info local_50;
  Type_Info local_38;
  Type_Info *local_20;
  Type_Info *inp_;
  Boxed_Value *t_bv_local;
  
  inp_ = (Type_Info *)t_bv;
  pTVar2 = Boxed_Value::get_type_info(t_bv);
  local_20 = pTVar2;
  user_type<double>();
  bVar1 = Type_Info::operator==(pTVar2,&local_38);
  pTVar2 = local_20;
  if (bVar1) {
    t_bv_local._7_1_ = true;
  }
  else {
    user_type<long_double>();
    bVar1 = Type_Info::operator==(pTVar2,&local_50);
    pTVar2 = local_20;
    if (bVar1) {
      t_bv_local._7_1_ = true;
    }
    else {
      user_type<float>();
      bVar1 = Type_Info::operator==(pTVar2,&local_68);
      if (bVar1) {
        t_bv_local._7_1_ = true;
      }
      else {
        t_bv_local._7_1_ = false;
      }
    }
  }
  return t_bv_local._7_1_;
}

Assistant:

static bool is_floating_point(const Boxed_Value &t_bv) {
      const Type_Info &inp_ = t_bv.get_type_info();

      if (inp_ == user_type<double>()) {
        return true;
      } else if (inp_ == user_type<long double>()) {
        return true;
      } else if (inp_ == user_type<float>()) {
        return true;
      } else {
        return false;
      }
    }